

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

ScalarFunction * duckdb::ListAggregateFun::GetFunction(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ScalarFunction *in_RDI;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_fffffffffffffe78;
  allocator_type local_181;
  code *bind_lambda;
  LogicalType local_160;
  LogicalType local_148;
  LogicalType local_130 [2];
  vector<duckdb::LogicalType,_true> local_100;
  LogicalType local_e8;
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(&local_160,ANY);
  LogicalType::LIST(local_130,&local_160);
  LogicalType::LogicalType(local_130 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_130;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_100,__l,
             &local_181);
  LogicalType::LogicalType(&local_148,ANY);
  bind_lambda = ListAggregateFunction;
  LogicalType::LogicalType(&local_e8,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_100,&local_148,(scalar_function_t *)&stack0xfffffffffffffe80,
             ListAggregateBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             ListAggregatesInitLocalState,(LogicalType)ZEXT824(&local_e8),CONSISTENT,
             in_stack_fffffffffffffe78,bind_lambda);
  LogicalType::~LogicalType(&local_e8);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffe80,(_Any_data *)&stack0xfffffffffffffe80,
               __destroy_functor);
  LogicalType::~LogicalType(&local_148);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_100);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_130[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::~LogicalType(&local_160);
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  LogicalType::LogicalType(local_130,ANY);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_130[0].id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_130[0].physical_type_;
  peVar1 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_130[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_130[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_130[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_130[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(local_130);
  in_RDI->serialize = ListAggregatesBindData::SerializeFunction;
  in_RDI->deserialize = ListAggregatesBindData::DeserializeFunction;
  return in_RDI;
}

Assistant:

ScalarFunction ListAggregateFun::GetFunction() {
	auto result =
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR}, LogicalType::ANY,
	                   ListAggregateFunction, ListAggregateBind, nullptr, nullptr, ListAggregatesInitLocalState);
	BaseScalarFunction::SetReturnsError(result);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.varargs = LogicalType::ANY;
	result.serialize = ListAggregatesBindData::SerializeFunction;
	result.deserialize = ListAggregatesBindData::DeserializeFunction;
	return result;
}